

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O0

int xmlSchemaCompareValuesInternal
              (xmlSchemaValType xtype,xmlSchemaValPtr x,xmlChar *xvalue,
              xmlSchemaWhitespaceValueType xws,xmlSchemaValType ytype,xmlSchemaValPtr y,
              xmlChar *yvalue,xmlSchemaWhitespaceValueType yws)

{
  xmlGenericErrorFunc p_Var1;
  int iVar2;
  xmlGenericErrorFunc *pp_Var3;
  void **ppvVar4;
  int ret_1;
  int ret;
  xmlChar *yv;
  xmlChar *xv;
  xmlSchemaValPtr y_local;
  xmlSchemaValType ytype_local;
  xmlSchemaWhitespaceValueType xws_local;
  xmlChar *xvalue_local;
  xmlSchemaValPtr x_local;
  xmlSchemaValType xtype_local;
  
  switch(xtype) {
  case XML_SCHEMAS_UNKNOWN:
  case XML_SCHEMAS_ANYTYPE:
    x_local._4_4_ = -2;
    break;
  case XML_SCHEMAS_STRING:
  case XML_SCHEMAS_NORMSTRING:
  case XML_SCHEMAS_TOKEN:
  case XML_SCHEMAS_LANGUAGE:
  case XML_SCHEMAS_NMTOKEN:
  case XML_SCHEMAS_NAME:
  case XML_SCHEMAS_NCNAME:
  case XML_SCHEMAS_ID:
  case XML_SCHEMAS_IDREF:
  case XML_SCHEMAS_ENTITY:
  case XML_SCHEMAS_ANYURI:
  case XML_SCHEMAS_ANYSIMPLETYPE:
    yv = xvalue;
    if (x != (xmlSchemaValPtr)0x0) {
      yv = (x->value).qname.name;
    }
    if (y == (xmlSchemaValPtr)0x0) {
      _ret_1 = yvalue;
    }
    else {
      _ret_1 = (y->value).qname.name;
    }
    if (ytype == XML_SCHEMAS_QNAME) {
      pp_Var3 = __xmlGenericError();
      p_Var1 = *pp_Var3;
      ppvVar4 = __xmlGenericErrorContext();
      (*p_Var1)(*ppvVar4,"Unimplemented block at %s:%d\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/xmlschemastypes.c"
                ,0x1306);
      if (y == (xmlSchemaValPtr)0x0) {
        x_local._4_4_ = -2;
      }
      else {
        x_local._4_4_ = -2;
      }
    }
    else {
      if ((((((ytype == XML_SCHEMAS_ANYSIMPLETYPE) || (ytype == XML_SCHEMAS_STRING)) ||
            ((ytype == XML_SCHEMAS_NORMSTRING ||
             ((((ytype == XML_SCHEMAS_TOKEN || (ytype == XML_SCHEMAS_LANGUAGE)) ||
               (ytype == XML_SCHEMAS_NMTOKEN)) ||
              ((ytype == XML_SCHEMAS_NAME || (ytype == XML_SCHEMAS_NCNAME)))))))) ||
           (ytype == XML_SCHEMAS_ID)) ||
          ((ytype == XML_SCHEMAS_IDREF || (ytype == XML_SCHEMAS_ENTITY)))) ||
         (ytype == XML_SCHEMAS_ANYURI)) {
        if (xws == XML_SCHEMA_WHITESPACE_PRESERVE) {
          if (yws == XML_SCHEMA_WHITESPACE_PRESERVE) {
            iVar2 = xmlStrEqual(yv,_ret_1);
            if (iVar2 != 0) {
              return 0;
            }
            return 2;
          }
          if (yws == XML_SCHEMA_WHITESPACE_REPLACE) {
            iVar2 = xmlSchemaComparePreserveReplaceStrings(yv,_ret_1,0);
            return iVar2;
          }
          if (yws == XML_SCHEMA_WHITESPACE_COLLAPSE) {
            iVar2 = xmlSchemaComparePreserveCollapseStrings(yv,_ret_1,0);
            return iVar2;
          }
        }
        else if (xws == XML_SCHEMA_WHITESPACE_REPLACE) {
          if (yws == XML_SCHEMA_WHITESPACE_PRESERVE) {
            iVar2 = xmlSchemaComparePreserveReplaceStrings(_ret_1,yv,1);
            return iVar2;
          }
          if (yws == XML_SCHEMA_WHITESPACE_REPLACE) {
            iVar2 = xmlSchemaCompareReplacedStrings(yv,_ret_1);
            return iVar2;
          }
          if (yws == XML_SCHEMA_WHITESPACE_COLLAPSE) {
            iVar2 = xmlSchemaCompareReplaceCollapseStrings(yv,_ret_1,0);
            return iVar2;
          }
        }
        else {
          if (xws != XML_SCHEMA_WHITESPACE_COLLAPSE) {
            return -2;
          }
          if (yws == XML_SCHEMA_WHITESPACE_PRESERVE) {
            iVar2 = xmlSchemaComparePreserveCollapseStrings(_ret_1,yv,1);
            return iVar2;
          }
          if (yws == XML_SCHEMA_WHITESPACE_REPLACE) {
            iVar2 = xmlSchemaCompareReplaceCollapseStrings(_ret_1,yv,1);
            return iVar2;
          }
          if (yws == XML_SCHEMA_WHITESPACE_COLLAPSE) {
            iVar2 = xmlSchemaCompareNormStrings(yv,_ret_1);
            return iVar2;
          }
        }
      }
      x_local._4_4_ = -2;
    }
    break;
  case XML_SCHEMAS_DECIMAL:
  case XML_SCHEMAS_INTEGER:
  case XML_SCHEMAS_NPINTEGER:
  case XML_SCHEMAS_NINTEGER:
  case XML_SCHEMAS_NNINTEGER:
  case XML_SCHEMAS_PINTEGER:
  case XML_SCHEMAS_INT:
  case XML_SCHEMAS_UINT:
  case XML_SCHEMAS_LONG:
  case XML_SCHEMAS_ULONG:
  case XML_SCHEMAS_SHORT:
  case XML_SCHEMAS_USHORT:
  case XML_SCHEMAS_BYTE:
  case XML_SCHEMAS_UBYTE:
    if ((x == (xmlSchemaValPtr)0x0) || (y == (xmlSchemaValPtr)0x0)) {
      x_local._4_4_ = -2;
    }
    else if (ytype == xtype) {
      x_local._4_4_ = xmlSchemaCompareDecimals(x,y);
    }
    else if ((((((ytype == XML_SCHEMAS_DECIMAL) || (ytype == XML_SCHEMAS_INTEGER)) ||
               (ytype == XML_SCHEMAS_NPINTEGER)) ||
              (((ytype == XML_SCHEMAS_NINTEGER || (ytype == XML_SCHEMAS_NNINTEGER)) ||
               ((ytype == XML_SCHEMAS_PINTEGER ||
                ((ytype == XML_SCHEMAS_INT || (ytype == XML_SCHEMAS_UINT)))))))) ||
             ((ytype == XML_SCHEMAS_LONG ||
              (((ytype == XML_SCHEMAS_ULONG || (ytype == XML_SCHEMAS_SHORT)) ||
               (ytype == XML_SCHEMAS_USHORT)))))) ||
            ((ytype == XML_SCHEMAS_BYTE || (ytype == XML_SCHEMAS_UBYTE)))) {
      x_local._4_4_ = xmlSchemaCompareDecimals(x,y);
    }
    else {
      x_local._4_4_ = -2;
    }
    break;
  case XML_SCHEMAS_TIME:
  case XML_SCHEMAS_GDAY:
  case XML_SCHEMAS_GMONTH:
  case XML_SCHEMAS_GMONTHDAY:
  case XML_SCHEMAS_GYEAR:
  case XML_SCHEMAS_GYEARMONTH:
  case XML_SCHEMAS_DATE:
  case XML_SCHEMAS_DATETIME:
    if ((x == (xmlSchemaValPtr)0x0) || (y == (xmlSchemaValPtr)0x0)) {
      x_local._4_4_ = -2;
    }
    else if (((((ytype == XML_SCHEMAS_DATETIME) || (ytype == XML_SCHEMAS_TIME)) ||
              (ytype == XML_SCHEMAS_GDAY)) ||
             ((ytype == XML_SCHEMAS_GMONTH || (ytype == XML_SCHEMAS_GMONTHDAY)))) ||
            ((ytype == XML_SCHEMAS_GYEAR ||
             ((ytype == XML_SCHEMAS_DATE || (ytype == XML_SCHEMAS_GYEARMONTH)))))) {
      x_local._4_4_ = xmlSchemaCompareDates(x,y);
    }
    else {
      x_local._4_4_ = -2;
    }
    break;
  case XML_SCHEMAS_DURATION:
    if ((x == (xmlSchemaValPtr)0x0) || (y == (xmlSchemaValPtr)0x0)) {
      x_local._4_4_ = -2;
    }
    else if (ytype == XML_SCHEMAS_DURATION) {
      x_local._4_4_ = xmlSchemaCompareDurations(x,y);
    }
    else {
      x_local._4_4_ = -2;
    }
    break;
  case XML_SCHEMAS_FLOAT:
  case XML_SCHEMAS_DOUBLE:
    if ((x == (xmlSchemaValPtr)0x0) || (y == (xmlSchemaValPtr)0x0)) {
      x_local._4_4_ = -2;
    }
    else if ((ytype == XML_SCHEMAS_FLOAT) || (ytype == XML_SCHEMAS_DOUBLE)) {
      x_local._4_4_ = xmlSchemaCompareFloats(x,y);
    }
    else {
      x_local._4_4_ = -2;
    }
    break;
  case XML_SCHEMAS_BOOLEAN:
    if ((x == (xmlSchemaValPtr)0x0) || (y == (xmlSchemaValPtr)0x0)) {
      x_local._4_4_ = -2;
    }
    else if (ytype == XML_SCHEMAS_BOOLEAN) {
      if ((x->value).b == (y->value).b) {
        x_local._4_4_ = 0;
      }
      else if ((x->value).b == 0) {
        x_local._4_4_ = -1;
      }
      else {
        x_local._4_4_ = 1;
      }
    }
    else {
      x_local._4_4_ = -2;
    }
    break;
  case XML_SCHEMAS_NMTOKENS:
  case XML_SCHEMAS_IDREFS:
  case XML_SCHEMAS_ENTITIES:
    pp_Var3 = __xmlGenericError();
    p_Var1 = *pp_Var3;
    ppvVar4 = __xmlGenericErrorContext();
    (*p_Var1)(*ppvVar4,"Unimplemented block at %s:%d\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/xmlschemastypes.c"
              ,0x1383);
  default:
    x_local._4_4_ = -2;
    break;
  case XML_SCHEMAS_QNAME:
  case XML_SCHEMAS_NOTATION:
    if ((x == (xmlSchemaValPtr)0x0) || (y == (xmlSchemaValPtr)0x0)) {
      x_local._4_4_ = -2;
    }
    else if ((ytype == XML_SCHEMAS_QNAME) || (ytype == XML_SCHEMAS_NOTATION)) {
      iVar2 = xmlStrEqual((x->value).qname.name,(y->value).qname.name);
      if ((iVar2 == 0) ||
         (iVar2 = xmlStrEqual((x->value).qname.uri,(y->value).qname.uri), iVar2 == 0)) {
        x_local._4_4_ = 2;
      }
      else {
        x_local._4_4_ = 0;
      }
    }
    else {
      x_local._4_4_ = -2;
    }
    break;
  case XML_SCHEMAS_HEXBINARY:
    if ((x == (xmlSchemaValPtr)0x0) || (y == (xmlSchemaValPtr)0x0)) {
      x_local._4_4_ = -2;
    }
    else if (ytype == XML_SCHEMAS_HEXBINARY) {
      if ((x->value).hex.total == (y->value).hex.total) {
        iVar2 = xmlStrcmp((x->value).qname.name,(y->value).qname.name);
        if (0 < iVar2) {
          return 1;
        }
        if (iVar2 == 0) {
          return 0;
        }
      }
      else if ((y->value).hex.total < (x->value).hex.total) {
        return 1;
      }
      x_local._4_4_ = -1;
    }
    else {
      x_local._4_4_ = -2;
    }
    break;
  case XML_SCHEMAS_BASE64BINARY:
    if ((x == (xmlSchemaValPtr)0x0) || (y == (xmlSchemaValPtr)0x0)) {
      x_local._4_4_ = -2;
    }
    else if (ytype == XML_SCHEMAS_BASE64BINARY) {
      if ((x->value).hex.total == (y->value).hex.total) {
        iVar2 = xmlStrcmp((x->value).qname.name,(y->value).qname.name);
        if (iVar2 < 1) {
          if (iVar2 == 0) {
            x_local._4_4_ = 0;
          }
          else {
            x_local._4_4_ = -1;
          }
        }
        else {
          x_local._4_4_ = 1;
        }
      }
      else if ((y->value).hex.total < (x->value).hex.total) {
        x_local._4_4_ = 1;
      }
      else {
        x_local._4_4_ = -1;
      }
    }
    else {
      x_local._4_4_ = -2;
    }
  }
  return x_local._4_4_;
}

Assistant:

static int
xmlSchemaCompareValuesInternal(xmlSchemaValType xtype,
			       xmlSchemaValPtr x,
			       const xmlChar *xvalue,
			       xmlSchemaWhitespaceValueType xws,
			       xmlSchemaValType ytype,
			       xmlSchemaValPtr y,
			       const xmlChar *yvalue,
			       xmlSchemaWhitespaceValueType yws)
{
    switch (xtype) {
	case XML_SCHEMAS_UNKNOWN:
	case XML_SCHEMAS_ANYTYPE:
	    return(-2);
        case XML_SCHEMAS_INTEGER:
        case XML_SCHEMAS_NPINTEGER:
        case XML_SCHEMAS_NINTEGER:
        case XML_SCHEMAS_NNINTEGER:
        case XML_SCHEMAS_PINTEGER:
        case XML_SCHEMAS_INT:
        case XML_SCHEMAS_UINT:
        case XML_SCHEMAS_LONG:
        case XML_SCHEMAS_ULONG:
        case XML_SCHEMAS_SHORT:
        case XML_SCHEMAS_USHORT:
        case XML_SCHEMAS_BYTE:
        case XML_SCHEMAS_UBYTE:
	case XML_SCHEMAS_DECIMAL:
	    if ((x == NULL) || (y == NULL))
		return(-2);
	    if (ytype == xtype)
		return(xmlSchemaCompareDecimals(x, y));
	    if ((ytype == XML_SCHEMAS_DECIMAL) ||
		(ytype == XML_SCHEMAS_INTEGER) ||
		(ytype == XML_SCHEMAS_NPINTEGER) ||
		(ytype == XML_SCHEMAS_NINTEGER) ||
		(ytype == XML_SCHEMAS_NNINTEGER) ||
		(ytype == XML_SCHEMAS_PINTEGER) ||
		(ytype == XML_SCHEMAS_INT) ||
		(ytype == XML_SCHEMAS_UINT) ||
		(ytype == XML_SCHEMAS_LONG) ||
		(ytype == XML_SCHEMAS_ULONG) ||
		(ytype == XML_SCHEMAS_SHORT) ||
		(ytype == XML_SCHEMAS_USHORT) ||
		(ytype == XML_SCHEMAS_BYTE) ||
		(ytype == XML_SCHEMAS_UBYTE))
		return(xmlSchemaCompareDecimals(x, y));
	    return(-2);
        case XML_SCHEMAS_DURATION:
	    if ((x == NULL) || (y == NULL))
		return(-2);
	    if (ytype == XML_SCHEMAS_DURATION)
                return(xmlSchemaCompareDurations(x, y));
            return(-2);
        case XML_SCHEMAS_TIME:
        case XML_SCHEMAS_GDAY:
        case XML_SCHEMAS_GMONTH:
        case XML_SCHEMAS_GMONTHDAY:
        case XML_SCHEMAS_GYEAR:
        case XML_SCHEMAS_GYEARMONTH:
        case XML_SCHEMAS_DATE:
        case XML_SCHEMAS_DATETIME:
	    if ((x == NULL) || (y == NULL))
		return(-2);
            if ((ytype == XML_SCHEMAS_DATETIME)  ||
                (ytype == XML_SCHEMAS_TIME)      ||
                (ytype == XML_SCHEMAS_GDAY)      ||
                (ytype == XML_SCHEMAS_GMONTH)    ||
                (ytype == XML_SCHEMAS_GMONTHDAY) ||
                (ytype == XML_SCHEMAS_GYEAR)     ||
                (ytype == XML_SCHEMAS_DATE)      ||
                (ytype == XML_SCHEMAS_GYEARMONTH))
                return (xmlSchemaCompareDates(x, y));
            return (-2);
	/*
	* Note that we will support comparison of string types against
	* anySimpleType as well.
	*/
	case XML_SCHEMAS_ANYSIMPLETYPE:
	case XML_SCHEMAS_STRING:
        case XML_SCHEMAS_NORMSTRING:
        case XML_SCHEMAS_TOKEN:
        case XML_SCHEMAS_LANGUAGE:
        case XML_SCHEMAS_NMTOKEN:
        case XML_SCHEMAS_NAME:
        case XML_SCHEMAS_NCNAME:
        case XML_SCHEMAS_ID:
        case XML_SCHEMAS_IDREF:
        case XML_SCHEMAS_ENTITY:
        case XML_SCHEMAS_ANYURI:
	{
	    const xmlChar *xv, *yv;

	    if (x == NULL)
		xv = xvalue;
	    else
		xv = x->value.str;
	    if (y == NULL)
		yv = yvalue;
	    else
		yv = y->value.str;
	    /*
	    * TODO: Compare those against QName.
	    */
	    if (ytype == XML_SCHEMAS_QNAME) {
		TODO
		if (y == NULL)
		    return(-2);
		return (-2);
	    }
            if ((ytype == XML_SCHEMAS_ANYSIMPLETYPE) ||
		(ytype == XML_SCHEMAS_STRING) ||
		(ytype == XML_SCHEMAS_NORMSTRING) ||
                (ytype == XML_SCHEMAS_TOKEN) ||
                (ytype == XML_SCHEMAS_LANGUAGE) ||
                (ytype == XML_SCHEMAS_NMTOKEN) ||
                (ytype == XML_SCHEMAS_NAME) ||
                (ytype == XML_SCHEMAS_NCNAME) ||
                (ytype == XML_SCHEMAS_ID) ||
                (ytype == XML_SCHEMAS_IDREF) ||
                (ytype == XML_SCHEMAS_ENTITY) ||
                (ytype == XML_SCHEMAS_ANYURI)) {

		if (xws == XML_SCHEMA_WHITESPACE_PRESERVE) {

		    if (yws == XML_SCHEMA_WHITESPACE_PRESERVE) {
			/* TODO: What about x < y or x > y. */
			if (xmlStrEqual(xv, yv))
			    return (0);
			else
			    return (2);
		    } else if (yws == XML_SCHEMA_WHITESPACE_REPLACE)
			return (xmlSchemaComparePreserveReplaceStrings(xv, yv, 0));
		    else if (yws == XML_SCHEMA_WHITESPACE_COLLAPSE)
			return (xmlSchemaComparePreserveCollapseStrings(xv, yv, 0));

		} else if (xws == XML_SCHEMA_WHITESPACE_REPLACE) {

		    if (yws == XML_SCHEMA_WHITESPACE_PRESERVE)
			return (xmlSchemaComparePreserveReplaceStrings(yv, xv, 1));
		    if (yws == XML_SCHEMA_WHITESPACE_REPLACE)
			return (xmlSchemaCompareReplacedStrings(xv, yv));
		    if (yws == XML_SCHEMA_WHITESPACE_COLLAPSE)
			return (xmlSchemaCompareReplaceCollapseStrings(xv, yv, 0));

		} else if (xws == XML_SCHEMA_WHITESPACE_COLLAPSE) {

		    if (yws == XML_SCHEMA_WHITESPACE_PRESERVE)
			return (xmlSchemaComparePreserveCollapseStrings(yv, xv, 1));
		    if (yws == XML_SCHEMA_WHITESPACE_REPLACE)
			return (xmlSchemaCompareReplaceCollapseStrings(yv, xv, 1));
		    if (yws == XML_SCHEMA_WHITESPACE_COLLAPSE)
			return (xmlSchemaCompareNormStrings(xv, yv));
		} else
		    return (-2);

	    }
            return (-2);
	}
        case XML_SCHEMAS_QNAME:
	case XML_SCHEMAS_NOTATION:
	    if ((x == NULL) || (y == NULL))
		return(-2);
            if ((ytype == XML_SCHEMAS_QNAME) ||
		(ytype == XML_SCHEMAS_NOTATION)) {
		if ((xmlStrEqual(x->value.qname.name, y->value.qname.name)) &&
		    (xmlStrEqual(x->value.qname.uri, y->value.qname.uri)))
		    return(0);
		return(2);
	    }
	    return (-2);
        case XML_SCHEMAS_FLOAT:
        case XML_SCHEMAS_DOUBLE:
	    if ((x == NULL) || (y == NULL))
		return(-2);
            if ((ytype == XML_SCHEMAS_FLOAT) ||
                (ytype == XML_SCHEMAS_DOUBLE))
                return (xmlSchemaCompareFloats(x, y));
            return (-2);
        case XML_SCHEMAS_BOOLEAN:
	    if ((x == NULL) || (y == NULL))
		return(-2);
            if (ytype == XML_SCHEMAS_BOOLEAN) {
		if (x->value.b == y->value.b)
		    return(0);
		if (x->value.b == 0)
		    return(-1);
		return(1);
	    }
	    return (-2);
        case XML_SCHEMAS_HEXBINARY:
	    if ((x == NULL) || (y == NULL))
		return(-2);
            if (ytype == XML_SCHEMAS_HEXBINARY) {
	        if (x->value.hex.total == y->value.hex.total) {
		    int ret = xmlStrcmp(x->value.hex.str, y->value.hex.str);
		    if (ret > 0)
			return(1);
		    else if (ret == 0)
			return(0);
		}
		else if (x->value.hex.total > y->value.hex.total)
		    return(1);

		return(-1);
            }
            return (-2);
        case XML_SCHEMAS_BASE64BINARY:
	    if ((x == NULL) || (y == NULL))
		return(-2);
            if (ytype == XML_SCHEMAS_BASE64BINARY) {
                if (x->value.base64.total == y->value.base64.total) {
                    int ret = xmlStrcmp(x->value.base64.str,
		                        y->value.base64.str);
                    if (ret > 0)
                        return(1);
                    else if (ret == 0)
                        return(0);
		    else
		        return(-1);
                }
                else if (x->value.base64.total > y->value.base64.total)
                    return(1);
                else
                    return(-1);
            }
            return (-2);
        case XML_SCHEMAS_IDREFS:
        case XML_SCHEMAS_ENTITIES:
        case XML_SCHEMAS_NMTOKENS:
	    TODO
	    break;
    }
    return -2;
}